

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftlzw.c
# Opt level: O0

FT_Error FT_Stream_OpenLZW(FT_Stream stream,FT_Stream source)

{
  FT_Memory memory_00;
  FT_LZWFile zip_00;
  FT_LZWFile zip;
  FT_Memory memory;
  FT_Stream pFStack_18;
  FT_Error error;
  FT_Stream source_local;
  FT_Stream stream_local;
  
  if ((stream == (FT_Stream)0x0) || (source == (FT_Stream)0x0)) {
    memory._4_4_ = 0x28;
  }
  else {
    memory_00 = source->memory;
    pFStack_18 = source;
    source_local = stream;
    memory._4_4_ = ft_lzw_check_header(source);
    if (memory._4_4_ == 0) {
      memset(source_local,0,0x50);
      source_local->memory = memory_00;
      zip_00 = (FT_LZWFile)ft_mem_qalloc(memory_00,0x1108,(FT_Error *)((long)&memory + 4));
      if (memory._4_4_ == 0) {
        memory._4_4_ = ft_lzw_file_init(zip_00,source_local,pFStack_18);
        if (memory._4_4_ != 0) {
          ft_mem_free(memory_00,zip_00);
          return memory._4_4_;
        }
        (source_local->descriptor).pointer = zip_00;
        memory._4_4_ = 0;
      }
      source_local->size = 0x7fffffff;
      source_local->pos = 0;
      source_local->base = (uchar *)0x0;
      source_local->read = ft_lzw_stream_io;
      source_local->close = ft_lzw_stream_close;
    }
  }
  return memory._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Stream_OpenLZW( FT_Stream  stream,
                     FT_Stream  source )
  {
    FT_Error    error;
    FT_Memory   memory;
    FT_LZWFile  zip = NULL;


    if ( !stream || !source )
    {
      error = FT_THROW( Invalid_Stream_Handle );
      goto Exit;
    }

    memory = source->memory;

    /*
     * Check the header right now; this prevents allocation of a huge
     * LZWFile object (400 KByte of heap memory) if not necessary.
     *
     * Did I mention that you should never use .Z compressed font
     * files?
     */
    error = ft_lzw_check_header( source );
    if ( error )
      goto Exit;

    FT_ZERO( stream );
    stream->memory = memory;

    if ( !FT_QNEW( zip ) )
    {
      error = ft_lzw_file_init( zip, stream, source );
      if ( error )
      {
        FT_FREE( zip );
        goto Exit;
      }

      stream->descriptor.pointer = zip;
    }

    stream->size  = 0x7FFFFFFFL;  /* don't know the real size! */
    stream->pos   = 0;
    stream->base  = NULL;
    stream->read  = ft_lzw_stream_io;
    stream->close = ft_lzw_stream_close;

  Exit:
    return error;
  }